

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_parameters.cpp
# Opt level: O0

CameraIntrinsics
polyscope::CameraIntrinsics::fromFoVDegHorizontalAndVertical(float *fovHorzDeg,float *fovVertDeg)

{
  float *in_RSI;
  float *in_RDI;
  float fVar1;
  double dVar2;
  double dVar3;
  CameraIntrinsics CVar4;
  float aspectRatioWidthOverHeight;
  float local_24;
  float *local_20;
  CameraIntrinsics local_c;
  
  local_20 = in_RSI;
  fVar1 = glm::radians<float>(*in_RDI);
  dVar2 = std::tan((double)(ulong)(uint)(fVar1 * 0.5));
  fVar1 = glm::radians<float>(*local_20);
  dVar3 = std::tan((double)(ulong)(uint)(fVar1 * 0.5));
  local_24 = SUB84(dVar2,0) / SUB84(dVar3,0);
  CameraIntrinsics(&local_c,local_20,&local_24);
  CVar4._8_4_ = (undefined4)CONCAT71(local_c._1_7_,local_c.isValidFlag);
  CVar4.fovVerticalDegrees = local_c.fovVerticalDegrees;
  CVar4.aspectRatioWidthOverHeight = local_c.aspectRatioWidthOverHeight;
  return CVar4;
}

Assistant:

CameraIntrinsics CameraIntrinsics::fromFoVDegHorizontalAndVertical(const float& fovHorzDeg, const float& fovVertDeg) {
  float aspectRatioWidthOverHeight =
      std::tan(0.5f * glm::radians(fovHorzDeg)) / std::tan(0.5f * glm::radians(fovVertDeg));
  return CameraIntrinsics(fovVertDeg, aspectRatioWidthOverHeight);
}